

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool google::ParseType(State *state)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined4 uVar6;
  undefined2 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  undefined4 uVar14;
  undefined2 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  int iVar18;
  short sVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  long lVar23;
  undefined8 *puVar24;
  char *pcVar25;
  char cVar26;
  State copy;
  State copy_1;
  
  pcVar1 = state->mangled_cur;
  pcVar2 = state->out_cur;
  pcVar3 = state->out_begin;
  pcVar4 = state->out_end;
  pcVar5 = state->prev_name;
  uVar6 = state->prev_name_length;
  uVar7 = state->nest_level;
  uVar8 = state->append;
  uVar9 = state->overflowed;
  bVar21 = ParseCVQualifiers(state);
  if ((bVar21) && (bVar21 = ParseType(state), bVar21)) {
    return true;
  }
  state->mangled_cur = pcVar1;
  state->out_cur = pcVar2;
  state->prev_name = pcVar5;
  state->prev_name_length = uVar6;
  state->nest_level = uVar7;
  state->append = (bool)uVar8;
  state->overflowed = (bool)uVar9;
  state->out_begin = pcVar3;
  state->out_end = pcVar4;
  cVar26 = 'O';
  lVar23 = 1;
  do {
    if (*state->mangled_cur == cVar26) {
      state->mangled_cur = state->mangled_cur + 1;
      bVar21 = ParseType(state);
      if (bVar21) {
        return true;
      }
      break;
    }
    cVar26 = "OPRCG"[lVar23];
    lVar23 = lVar23 + 1;
  } while (lVar23 != 6);
  state->mangled_cur = pcVar1;
  state->out_cur = pcVar2;
  state->prev_name = pcVar5;
  state->prev_name_length = uVar6;
  state->nest_level = uVar7;
  state->append = (bool)uVar8;
  state->overflowed = (bool)uVar9;
  state->out_begin = pcVar3;
  state->out_end = pcVar4;
  pcVar25 = state->mangled_cur;
  if ((*pcVar25 == 'D') && (pcVar25[1] == 'p')) {
    state->mangled_cur = pcVar25 + 2;
    bVar21 = ParseType(state);
    if (bVar21) {
      return true;
    }
  }
  state->mangled_cur = pcVar1;
  state->out_cur = pcVar2;
  state->prev_name = pcVar5;
  state->prev_name_length = uVar6;
  state->nest_level = uVar7;
  state->append = (bool)uVar8;
  state->overflowed = (bool)uVar9;
  state->out_begin = pcVar3;
  state->out_end = pcVar4;
  pcVar25 = state->mangled_cur;
  if ((*pcVar25 == 'D') && (state->mangled_cur = pcVar25 + 1, (byte)(pcVar25[1] | 0x20U) == 0x74)) {
    state->mangled_cur = pcVar25 + 2;
    bVar21 = ParseExpression(state);
    if ((!bVar21) || (pcVar25 = state->mangled_cur, *pcVar25 != 'E')) goto LAB_0011a236;
LAB_0011a319:
    state->mangled_cur = pcVar25 + 1;
  }
  else {
LAB_0011a236:
    state->mangled_cur = pcVar1;
    state->out_cur = pcVar2;
    state->prev_name = pcVar5;
    state->prev_name_length = uVar6;
    state->nest_level = uVar7;
    state->append = (bool)uVar8;
    state->overflowed = (bool)uVar9;
    state->out_begin = pcVar3;
    state->out_end = pcVar4;
    if (*state->mangled_cur == 'U') {
      state->mangled_cur = state->mangled_cur + 1;
      bVar21 = ParseSourceName(state);
      if ((bVar21) && (bVar21 = ParseType(state), bVar21)) {
        return true;
      }
    }
    state->mangled_cur = pcVar1;
    state->out_cur = pcVar2;
    state->prev_name = pcVar5;
    state->prev_name_length = uVar6;
    state->nest_level = uVar7;
    state->append = (bool)uVar8;
    state->overflowed = (bool)uVar9;
    state->out_begin = pcVar3;
    state->out_end = pcVar4;
    cVar26 = *state->mangled_cur;
    pcVar25 = "v";
    puVar24 = (undefined8 *)(kBuiltinTypeList + 0x10);
    do {
      if (cVar26 == *pcVar25) {
        MaybeAppend(state,(char *)puVar24[-1]);
        state->mangled_cur = state->mangled_cur + 1;
        return true;
      }
      pcVar25 = (char *)*puVar24;
      puVar24 = puVar24 + 2;
    } while (pcVar25 != (char *)0x0);
    if (cVar26 == 'u') {
      state->mangled_cur = state->mangled_cur + 1;
      bVar21 = ParseSourceName(state);
      if (bVar21) {
        return true;
      }
    }
    state->mangled_cur = pcVar1;
    state->out_cur = pcVar2;
    state->prev_name = pcVar5;
    state->prev_name_length = uVar6;
    state->nest_level = uVar7;
    state->append = (bool)uVar8;
    state->overflowed = (bool)uVar9;
    state->out_begin = pcVar3;
    state->out_end = pcVar4;
    pcVar25 = state->mangled_cur;
    if (*pcVar25 == 'F') {
      state->mangled_cur = pcVar25 + 1;
      if (pcVar25[1] == 'Y') {
        state->mangled_cur = pcVar25 + 2;
      }
      bVar21 = ParseBareFunctionType(state);
      if ((bVar21) && (pcVar25 = state->mangled_cur, *pcVar25 == 'E')) goto LAB_0011a319;
    }
    state->prev_name = pcVar5;
    state->prev_name_length = uVar6;
    state->nest_level = uVar7;
    state->append = (bool)uVar8;
    state->overflowed = (bool)uVar9;
    state->out_begin = pcVar3;
    state->out_end = pcVar4;
    state->mangled_cur = pcVar1;
    state->out_cur = pcVar2;
    bVar21 = ParseName(state);
    if (!bVar21) {
      pcVar25 = state->mangled_cur;
      pcVar10 = state->out_cur;
      pcVar11 = state->out_begin;
      pcVar12 = state->out_end;
      pcVar13 = state->prev_name;
      uVar14 = state->prev_name_length;
      uVar15 = state->nest_level;
      uVar16 = state->append;
      uVar17 = state->overflowed;
      if (*state->mangled_cur == 'A') {
        state->mangled_cur = state->mangled_cur + 1;
        bVar21 = ParseNumber(state,(int *)0x0);
        if ((bVar21) && (*state->mangled_cur == '_')) {
          state->mangled_cur = state->mangled_cur + 1;
          bVar21 = ParseType(state);
          if (bVar21) {
            return true;
          }
        }
      }
      state->mangled_cur = pcVar25;
      state->out_cur = pcVar10;
      state->prev_name = pcVar13;
      state->prev_name_length = uVar14;
      state->nest_level = uVar15;
      state->append = (bool)uVar16;
      state->overflowed = (bool)uVar17;
      state->out_begin = pcVar11;
      state->out_end = pcVar12;
      if (*state->mangled_cur == 'A') {
        state->mangled_cur = state->mangled_cur + 1;
        ParseExpression(state);
        if (*state->mangled_cur == '_') {
          state->mangled_cur = state->mangled_cur + 1;
          bVar21 = ParseType(state);
          if (bVar21) {
            return true;
          }
        }
      }
      state->prev_name = pcVar13;
      state->prev_name_length = uVar14;
      state->nest_level = uVar15;
      state->append = (bool)uVar16;
      state->overflowed = (bool)uVar17;
      state->out_begin = pcVar11;
      state->out_end = pcVar12;
      state->mangled_cur = pcVar25;
      state->out_cur = pcVar10;
      pcVar25 = state->mangled_cur;
      pcVar10 = state->out_cur;
      pcVar11 = state->out_begin;
      pcVar12 = state->out_end;
      pcVar13 = state->prev_name;
      iVar18 = state->prev_name_length;
      sVar19 = state->nest_level;
      bVar21 = state->append;
      bVar20 = state->overflowed;
      if (*state->mangled_cur == 'M') {
        state->mangled_cur = state->mangled_cur + 1;
        bVar22 = ParseType(state);
        if ((bVar22) && (bVar22 = ParseType(state), bVar22)) {
          return true;
        }
      }
      state->prev_name = pcVar13;
      state->prev_name_length = iVar18;
      state->nest_level = sVar19;
      state->append = bVar21;
      state->overflowed = bVar20;
      state->out_begin = pcVar11;
      state->out_end = pcVar12;
      state->mangled_cur = pcVar25;
      state->out_cur = pcVar10;
      bVar21 = ParseSubstitution(state);
      if ((!bVar21) &&
         (((bVar21 = ParseTemplateParam(state), !bVar21 &&
           (bVar21 = ParseSubstitution(state), !bVar21)) ||
          (bVar21 = ParseTemplateArgs(state), !bVar21)))) {
        state->prev_name = pcVar5;
        state->prev_name_length = uVar6;
        state->nest_level = uVar7;
        state->append = (bool)uVar8;
        state->overflowed = (bool)uVar9;
        state->out_begin = pcVar3;
        state->out_end = pcVar4;
        state->mangled_cur = pcVar1;
        state->out_cur = pcVar2;
        bVar21 = ParseTemplateParam(state);
        return bVar21;
      }
    }
  }
  return true;
}

Assistant:

static bool ParseType(State *state) {
  // We should check CV-qualifers, and PRGC things first.
  State copy = *state;
  if (ParseCVQualifiers(state) && ParseType(state)) {
    return true;
  }
  *state = copy;

  if (ParseCharClass(state, "OPRCG") && ParseType(state)) {
    return true;
  }
  *state = copy;

  if (ParseTwoCharToken(state, "Dp") && ParseType(state)) {
    return true;
  }
  *state = copy;

  if (ParseOneCharToken(state, 'D') && ParseCharClass(state, "tT") &&
      ParseExpression(state) && ParseOneCharToken(state, 'E')) {
    return true;
  }
  *state = copy;

  if (ParseOneCharToken(state, 'U') && ParseSourceName(state) &&
      ParseType(state)) {
    return true;
  }
  *state = copy;

  if (ParseBuiltinType(state) ||
      ParseFunctionType(state) ||
      ParseClassEnumType(state) ||
      ParseArrayType(state) ||
      ParsePointerToMemberType(state) ||
      ParseSubstitution(state)) {
    return true;
  }

  if (ParseTemplateTemplateParam(state) &&
      ParseTemplateArgs(state)) {
    return true;
  }
  *state = copy;

  // Less greedy than <template-template-param> <template-args>.
  if (ParseTemplateParam(state)) {
    return true;
  }

  return false;
}